

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

char * ImGui::TableGetColumnName(int column_n)

{
  ImGuiTable *table;
  char *pcVar1;
  long lVar2;
  
  table = GImGui->CurrentTable;
  if (table == (ImGuiTable *)0x0) {
    return (char *)0x0;
  }
  if (column_n < 0) {
    pcVar1 = TableGetColumnName(table,table->CurrentColumn);
    return pcVar1;
  }
  pcVar1 = "";
  if (((table->IsLayoutLocked != false) || (column_n < table->DeclColumnsCount)) &&
     (lVar2 = (long)(table->Columns).Data[column_n].NameOffset, lVar2 != -1)) {
    pcVar1 = (table->ColumnsNames).Buf.Data + lVar2;
  }
  return pcVar1;
}

Assistant:

const char* ImGui::TableGetColumnName(int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    if (!table)
        return NULL;
    if (column_n < 0)
        column_n = table->CurrentColumn;
    return TableGetColumnName(table, column_n);
}